

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::
     PrintTupleTo<std::tuple<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*),std::tuple<int,int>>,2ul>
               (tuple<int,_int> *t,ostream *param_2)

{
  PrintWithFallback<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*)>
            ((_func_void_uchar_ptr_int_uchar_ptr_int_int_int_InterpFilterParams_ptr_InterpFilterParams_ptr_int_int_int_int_ConvolveParams_ptr
              **)(t + 1),param_2);
  std::operator<<(param_2,", ");
  PrintTo<int,int>(t,param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}